

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O2

int kvtree_util_get_str(kvtree *hash,char *key,char **val)

{
  char *pcVar1;
  
  pcVar1 = kvtree_get_val(hash,key);
  if (pcVar1 != (char *)0x0) {
    *val = pcVar1;
  }
  return (uint)(pcVar1 == (char *)0x0);
}

Assistant:

int kvtree_util_get_str(const kvtree* hash, const char* key, char** val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    *val = val_str;
    rc = KVTREE_SUCCESS;
  }

  return rc;
}